

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

Type __thiscall Parse::toType(Parse *this,string *basic_string)

{
  int iVar1;
  Type TVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)basic_string);
  if (iVar1 == 0) {
    TVar2 = INT;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)basic_string);
    if (iVar1 == 0) {
      TVar2 = BOOL;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)basic_string);
      TVar2 = DOUBLE;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)basic_string);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)basic_string);
          if (iVar1 == 0) {
            TVar2 = CHAR;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)basic_string);
            if (iVar1 == 0) {
              TVar2 = ARRAY;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)basic_string);
              if (iVar1 == 0) {
                TVar2 = STRING;
              }
              else {
                std::__cxx11::string::compare((char *)basic_string);
                TVar2 = VOID;
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Type Parse::toType(string basic_string) {
    if(basic_string == "int") {
        return Type::INT;
    } else if(basic_string == "bool") {
        return Type::BOOL;
    } else if(basic_string == "float" || basic_string == "double") {
        return Type ::DOUBLE;
    } else if(basic_string == "char") {
        return Type ::CHAR;
    } else if(basic_string == "arr") {
        return Type ::ARRAY;
    } else if(basic_string == "string") {
        return Type::STRING;
    } else if(basic_string == "void") {
        return Type::VOID;
    }
}